

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::js::(anonymous_namespace)::JSObjectFieldName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,GeneratorOptions *options,
          FieldDescriptor *field)

{
  bool bVar1;
  bool in_R8B;
  bool in_R9B;
  long lVar2;
  string in_stack_ffffffffffffffc8;
  
  lVar2 = 0;
  JSIdent_abi_cxx11_(__return_storage_ptr__,this,(GeneratorOptions *)0x0,(FieldDescriptor *)0x0,
                     in_R8B,in_R9B,(bool)in_stack_ffffffffffffffc8);
  do {
    if (lVar2 == 0x1d0) {
      return __return_storage_ptr__;
    }
    bVar1 = std::operator==(__return_storage_ptr__,*(char **)((long)&kKeyword + lVar2));
    lVar2 = lVar2 + 8;
  } while (!bVar1);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &stack0xffffffffffffffc8,"pb_",__return_storage_ptr__);
  std::__cxx11::string::operator=
            ((string *)__return_storage_ptr__,(string *)&stack0xffffffffffffffc8);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
  return __return_storage_ptr__;
}

Assistant:

std::string JSObjectFieldName(const GeneratorOptions& options,
                              const FieldDescriptor* field) {
  std::string name = JSIdent(options, field,
                             /* is_upper_camel = */ false,
                             /* is_map = */ false,
                             /* drop_list = */ false);
  if (IsReserved(name)) {
    name = "pb_" + name;
  }
  return name;
}